

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_17b8f50::BlendA64MaskTest8B_d16_DISABLED_Speed_Test::TestBody
          (BlendA64MaskTest8B_d16_DISABLED_Speed_Test *this)

{
  ACMRandom *this_00;
  uint8_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  int bsize;
  int block_size;
  long lVar4;
  
  this_00 = &(this->super_BlendA64MaskTest8B_d16).
             super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
             .
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*)>
             .rng_;
  for (block_size = 0; block_size != 0x16; block_size = block_size + 1) {
    for (lVar4 = 0x14020; lVar4 != 0x28020; lVar4 = lVar4 + 1) {
      uVar1 = libaom_test::ACMRandom::Rand8(this_00);
      *(uint8_t *)((long)this + lVar4 + -0x13fe8) = uVar1;
      uVar1 = libaom_test::ACMRandom::Rand8(this_00);
      (this->super_BlendA64MaskTest8B_d16).
      super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
      .dst_ref_[lVar4 + -0x20] = uVar1;
      uVar2 = libaom_test::ACMRandom::Rand16(this_00);
      *(uint16_t *)
       ((this->super_BlendA64MaskTest8B_d16).
        super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
        .dst_ref_ + lVar4 * 2 + -0x38) = uVar2 & 0x3fff;
      uVar2 = libaom_test::ACMRandom::Rand16(this_00);
      (this->super_BlendA64MaskTest8B_d16).
      super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
      .src0_[lVar4 + -0x1c] = uVar2 & 0x3fff;
    }
    for (lVar4 = 0x78050; lVar4 != 0x88050; lVar4 = lVar4 + 1) {
      uVar3 = testing::internal::Random::Generate(&this_00->random_,0x41);
      (this->super_BlendA64MaskTest8B_d16).
      super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
      .dst_ref_[lVar4 + -0x38] = (uchar)uVar3;
    }
    BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
    ::RunTest((BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
               *)this,block_size,10000000);
  }
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B_d16, DISABLED_Speed) {
  const int kRunTimes = 10000000;
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_.Rand8();
      dst_tst_[i] = rng_.Rand8();

      src0_[i] = rng_.Rand16() & kSrcMaxBitsMask;
      src1_[i] = rng_.Rand16() & kSrcMaxBitsMask;
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

    RunTest(bsize, kRunTimes);
  }
}